

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCommand.h
# Opt level: O3

char * __thiscall cmCommand::GetError(cmCommand *this)

{
  string *this_00;
  long *local_30 [2];
  long local_20 [2];
  
  this_00 = &this->Error;
  if ((this->Error)._M_string_length == 0) {
    (*(this->super_cmObject)._vptr_cmObject[0xc])((string *)local_30,this);
    std::__cxx11::string::operator=((string *)this_00,(string *)local_30);
    if (local_30[0] != local_20) {
      operator_delete(local_30[0],local_20[0] + 1);
    }
    std::__cxx11::string::append((char *)this_00);
  }
  return (this_00->_M_dataplus)._M_p;
}

Assistant:

const char* GetError()
    {
      if(this->Error.empty())
        {
        this->Error = this->GetName();
        this->Error += " unknown error.";
        }
      return this->Error.c_str();
    }